

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreply.cpp
# Opt level: O2

void __thiscall QNetworkReplyPrivate::QNetworkReplyPrivate(QNetworkReplyPrivate *this)

{
  long in_FS_OFFSET;
  Attribute local_44;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QIODevicePrivate::QIODevicePrivate(&this->super_QIODevicePrivate,QObjectPrivateVersion);
  QNetworkHeadersPrivate::QNetworkHeadersPrivate(&this->super_QNetworkHeadersPrivate);
  *(undefined ***)this = &PTR__QNetworkReplyPrivate_002ca148;
  QNetworkRequest::QNetworkRequest(&this->request);
  QNetworkRequest::QNetworkRequest(&this->originalRequest);
  QUrl::QUrl(&this->url);
  this->readBufferMaxSize = 0;
  (this->manager).wp.d = (Data *)0x0;
  (this->manager).wp.value = (QObject *)0x0;
  (this->downloadProgressSignalChoke).t1 = -0x8000000000000000;
  (this->downloadProgressSignalChoke).t2 = -0x8000000000000000;
  (this->uploadProgressSignalChoke).t1 = -0x8000000000000000;
  (this->uploadProgressSignalChoke).t2 = -0x8000000000000000;
  this->emitAllUploadProgressSignals = false;
  this->operation = UnknownOperation;
  this->errorCode = NoError;
  this->isFinished = false;
  local_44 = ConnectionEncryptedAttribute;
  QVariant::QVariant(&local_40,false);
  QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
            ((QHash<QNetworkRequest::Attribute,QVariant> *)
             &(this->super_QNetworkHeadersPrivate).attributes,&local_44,&local_40);
  QVariant::~QVariant(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyPrivate::QNetworkReplyPrivate()
    : readBufferMaxSize(0),
      emitAllUploadProgressSignals(false),
      operation(QNetworkAccessManager::UnknownOperation),
      errorCode(QNetworkReply::NoError)
    , isFinished(false)
{
    // set the default attribute values
    attributes.insert(QNetworkRequest::ConnectionEncryptedAttribute, false);
}